

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall sing::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pthread_mutex_t *__mutex;
  pointer ptVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  undefined8 uVar3;
  thread *thread;
  pointer ptVar4;
  
  __mutex = (pthread_mutex_t *)
            (this->pool_).super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    uVar3 = std::__throw_system_error(iVar2);
    __clang_call_terminate(uVar3);
  }
  ((this->pool_).super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->stop = true;
  pthread_mutex_unlock(__mutex);
  std::condition_variable::notify_all();
  ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar4 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads);
  this_00 = (this->pool_).super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~ThreadPool(){//pool_对象是线程池的成员，池析构时会调用pool对象的析构，这里表现为减少智能指针的引用计数
        if ((bool)pool_)
        {
            std::lock_guard<std::mutex> lock(pool_->mutex);
            pool_->stop = true;
        }
        pool_->cond.notify_all();
for(auto& thread:threads){
    thread.join();
}       
    }